

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert_macro.c
# Opt level: O2

uint string_to_status_code(char *status_code_string)

{
  int iVar1;
  char **ppcVar2;
  long lVar3;
  
  ppcVar2 = status_code_strings;
  lVar3 = 0;
  while( true ) {
    if (lVar3 == 3) {
      return 0xffffffff;
    }
    iVar1 = strcmp(*ppcVar2,status_code_string);
    if (iVar1 == 0) break;
    lVar3 = lVar3 + 1;
    ppcVar2 = ppcVar2 + 1;
  }
  return (uint)lVar3;
}

Assistant:

unsigned int string_to_status_code(const char* const status_code_string) {
    unsigned int i;
    for (i = 0; i < sizeof(status_code_strings) /
                    sizeof(status_code_strings[0]); i++) {
        if (strcmp(status_code_strings[i], status_code_string) == 0) {
            return i;
        }
    }
    return ~0U;
}